

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O3

QPalette __thiscall QStyle::standardPalette(QStyle *this)

{
  undefined8 extraout_RDX;
  ColorGroup CVar1;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  QPalette QVar3;
  QColor QStack_a8;
  QColor local_98;
  QColor local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QColor local_68;
  QColor local_58;
  QColor local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.cspec = Rgb;
  local_48.ct._0_8_ = 0xc8c8d0d0d4d4ffff;
  local_48._12_4_ = 0xaaaa0000;
  local_58._12_4_ = 0xaaaaaaaa;
  auVar2 = QColor::lighter((int)&local_48);
  local_58._0_8_ = auVar2._0_8_;
  local_58.ct._4_4_ = auVar2._8_4_;
  local_58.ct.argb.pad = auVar2._12_2_;
  local_68._12_4_ = 0xaaaaaaaa;
  auVar2 = QColor::darker((int)&local_48);
  local_68._0_8_ = auVar2._0_8_;
  local_68.ct._4_4_ = auVar2._8_4_;
  local_68.ct.argb.pad = auVar2._12_2_;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QColor::QColor((QColor *)&local_78,gray);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&this->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  QColor::QColor(&local_88,black);
  QColor::QColor(&local_98,black);
  QColor::QColor(&QStack_a8,white);
  QPalette::QPalette((QPalette *)this,&local_88,&local_48,&local_58,&local_68,(QColor *)&local_78,
                     &local_98,&QStack_a8);
  QBrush::QBrush((QBrush *)&local_88,&local_68,SolidPattern);
  CVar1 = (ColorGroup)this;
  QPalette::setBrush(CVar1,Button,(QBrush *)0x0);
  QBrush::~QBrush((QBrush *)&local_88);
  QBrush::QBrush((QBrush *)&local_88,&local_68,SolidPattern);
  QPalette::setBrush(CVar1,Button,(QBrush *)0x6);
  QBrush::~QBrush((QBrush *)&local_88);
  QBrush::QBrush((QBrush *)&local_88,&local_68,SolidPattern);
  QPalette::setBrush(CVar1,Button,(QBrush *)0x8);
  QBrush::~QBrush((QBrush *)&local_88);
  QBrush::QBrush((QBrush *)&local_88,&local_48,SolidPattern);
  QPalette::setBrush(CVar1,Button,(QBrush *)0x9);
  QBrush::~QBrush((QBrush *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar3._8_8_ = extraout_RDX;
    QVar3.d = (QPalettePrivate *)this;
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QPalette QStyle::standardPalette() const
{
    QColor background = QColor(0xd4, 0xd0, 0xc8); // win 2000 grey

    QColor light(background.lighter());
    QColor dark(background.darker());
    QColor mid(Qt::gray);
    QPalette palette(Qt::black, background, light, dark, mid, Qt::black, Qt::white);
    palette.setBrush(QPalette::Disabled, QPalette::WindowText, dark);
    palette.setBrush(QPalette::Disabled, QPalette::Text, dark);
    palette.setBrush(QPalette::Disabled, QPalette::ButtonText, dark);
    palette.setBrush(QPalette::Disabled, QPalette::Base, background);
    return palette;
}